

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# worm.c
# Opt level: O0

void place_worm_tail_randomly(monst *worm,xchar x,xchar y)

{
  char cVar1;
  boolean bVar2;
  bool local_36;
  char local_35;
  char local_34;
  char local_33;
  xchar local_32;
  xchar local_31;
  char tryct;
  xchar ny;
  xchar nx;
  xchar oy;
  wseg *pwStack_30;
  xchar ox;
  wseg *new_tail;
  wseg *curr;
  level *lev;
  int wnum;
  xchar y_local;
  xchar x_local;
  monst *worm_local;
  
  lev._0_4_ = (uint)worm->wormno;
  curr = (wseg *)worm->dlevel;
  pwStack_30 = ((level *)curr)->wtails[(int)(uint)lev];
  local_32 = y;
  local_31 = x;
  new_tail = pwStack_30;
  lev._6_1_ = y;
  lev._7_1_ = x;
  _wnum = worm;
  if ((uint)lev == 0) {
    warning("place_worm_tail_randomly: worm->wormno was 0");
  }
  else if (((uint)lev == 0) ||
          ((((level *)curr)->wtails[(int)(uint)lev] != (wseg *)0x0 &&
           (((level *)curr)->wheads[(int)(uint)lev] != (wseg *)0x0)))) {
    ((level *)curr)->wheads[(int)(uint)lev] = pwStack_30;
    new_tail = pwStack_30->nseg;
    pwStack_30->nseg = (wseg *)0x0;
    pwStack_30->wx = x;
    pwStack_30->wy = y;
    while (new_tail != (wseg *)0x0) {
      local_35 = '\0';
      do {
        cVar1 = local_35;
        random_dir(local_31,local_32,&local_33,&local_34);
        bVar2 = goodpos((level *)curr,(int)local_33,(int)local_34,_wnum,0);
        if (bVar2 == '\0') {
          local_35 = local_35 + '\x01';
        }
        local_36 = bVar2 == '\0' && cVar1 < '2';
      } while (local_36);
      if (local_35 < '2') {
        _wnum->dlevel->monsters[local_33][local_34] = _wnum;
        local_31 = local_33;
        new_tail->wx = local_33;
        local_32 = local_34;
        new_tail->wy = local_34;
        (&curr[0xffe].nseg)[(int)(uint)lev] = new_tail;
        new_tail = new_tail->nseg;
        (&curr[0xffe].nseg)[(int)(uint)lev]->nseg = pwStack_30;
        pwStack_30 = (&curr[0xffe].nseg)[(int)(uint)lev];
        newsym((int)local_33,(int)local_34);
      }
      else {
        toss_wsegs((level *)curr,new_tail,'\0');
        new_tail = (wseg *)0x0;
      }
    }
  }
  else {
    warning("place_worm_tail_randomly: wormno is set without a tail!");
  }
  return;
}

Assistant:

void place_worm_tail_randomly(struct monst *worm, xchar x, xchar y)
{
    int wnum = worm->wormno;
    struct level *lev = worm->dlevel;
    struct wseg *curr = lev->wtails[wnum];
    struct wseg *new_tail;
    xchar ox = x, oy = y;

    if (!wnum) {
	warning("place_worm_tail_randomly: worm->wormno was 0");
	return;
    }

    if (wnum && (!lev->wtails[wnum] || !lev->wheads[wnum]) ) {
	warning("place_worm_tail_randomly: wormno is set without a tail!");
	return;
    }

    lev->wheads[wnum] = new_tail = curr;
    curr = curr->nseg;
    new_tail->nseg = NULL;
    new_tail->wx = x;
    new_tail->wy = y;

    while (curr)  {
	xchar nx, ny;
	char tryct = 0;

	/* pick a random direction from x, y and search for goodpos() */

	do {
	    random_dir(ox, oy, &nx, &ny);
	} while (!goodpos(lev, nx, ny, worm, 0) && (tryct++ < 50));

	if (tryct < 50)  {
	    place_worm_seg(worm, nx, ny);
	    curr->wx = ox = nx;
	    curr->wy = oy = ny;
	    lev->wtails[wnum] = curr;
	    curr = curr->nseg;
	    lev->wtails[wnum]->nseg = new_tail;
	    new_tail = lev->wtails[wnum];
	    newsym(nx, ny);
	} else {			/* Oops.  Truncate because there was */
	    toss_wsegs(lev, curr, FALSE);    /* no place for the rest of it */
	    curr = NULL;
	}
    }
}